

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinitionUtil.cpp
# Opt level: O3

void deqp::gles31::Functional::anon_unknown_3::collectNamedStructureDefinitions
               (vector<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_> *dst,
               VarType *type)

{
  pointer ppSVar1;
  char *a;
  pointer ppSVar2;
  deBool dVar3;
  long lVar4;
  pointer pSVar5;
  pointer ppSVar6;
  long lVar7;
  StructType *local_38;
  
  for (; type->m_type == TYPE_ARRAY; type = (type->m_data).array.elementType) {
  }
  if (type->m_type != TYPE_STRUCT) {
    return;
  }
  local_38 = (type->m_data).structPtr;
  if ((local_38->m_typeName)._M_string_length == 0) goto LAB_006706c2;
  ppSVar6 = (dst->
            super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppSVar1 = (dst->
            super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  a = (local_38->m_typeName)._M_dataplus._M_p;
  lVar7 = (long)ppSVar1 - (long)ppSVar6;
  if (0 < lVar7 >> 5) {
    lVar4 = (lVar7 >> 5) + 1;
    ppSVar2 = ppSVar6 + 2;
    do {
      ppSVar6 = ppSVar2;
      if (((ppSVar6[-2]->m_typeName)._M_string_length != 0) &&
         (dVar3 = deStringEqual(a,(ppSVar6[-2]->m_typeName)._M_dataplus._M_p), dVar3 == 1)) {
        ppSVar6 = ppSVar6 + -2;
        goto LAB_006706b8;
      }
      if (((ppSVar6[-1]->m_typeName)._M_string_length != 0) &&
         (dVar3 = deStringEqual(a,(ppSVar6[-1]->m_typeName)._M_dataplus._M_p), dVar3 == 1)) {
        ppSVar6 = ppSVar6 + -1;
        goto LAB_006706b8;
      }
      if ((((*ppSVar6)->m_typeName)._M_string_length != 0) &&
         (dVar3 = deStringEqual(a,((*ppSVar6)->m_typeName)._M_dataplus._M_p), dVar3 == 1))
      goto LAB_006706b8;
      if (((ppSVar6[1]->m_typeName)._M_string_length != 0) &&
         (dVar3 = deStringEqual(a,(ppSVar6[1]->m_typeName)._M_dataplus._M_p), dVar3 == 1)) {
        ppSVar6 = ppSVar6 + 1;
        goto LAB_006706b8;
      }
      lVar4 = lVar4 + -1;
      lVar7 = lVar7 + -0x20;
      ppSVar2 = ppSVar6 + 4;
    } while (1 < lVar4);
    ppSVar6 = ppSVar6 + 2;
  }
  lVar7 = lVar7 >> 3;
  if (lVar7 == 1) {
LAB_00670686:
    if ((((*ppSVar6)->m_typeName)._M_string_length == 0) ||
       (dVar3 = deStringEqual(a,((*ppSVar6)->m_typeName)._M_dataplus._M_p), dVar3 != 1)) {
LAB_006706a1:
      ppSVar6 = ppSVar1;
    }
  }
  else if (lVar7 == 2) {
LAB_00670667:
    if ((((*ppSVar6)->m_typeName)._M_string_length == 0) ||
       (dVar3 = deStringEqual(a,((*ppSVar6)->m_typeName)._M_dataplus._M_p), dVar3 != 1)) {
      ppSVar6 = ppSVar6 + 1;
      goto LAB_00670686;
    }
  }
  else {
    if (lVar7 != 3) goto LAB_006706a1;
    if ((((*ppSVar6)->m_typeName)._M_string_length == 0) ||
       (dVar3 = deStringEqual(a,((*ppSVar6)->m_typeName)._M_dataplus._M_p), dVar3 != 1)) {
      ppSVar6 = ppSVar6 + 1;
      goto LAB_00670667;
    }
  }
LAB_006706b8:
  if (ppSVar6 !=
      (dst->super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    return;
  }
  local_38 = (type->m_data).structPtr;
LAB_006706c2:
  pSVar5 = (local_38->m_members).
           super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(local_38->m_members).
                              super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar5) >> 3) *
          -0x49249249) {
    lVar4 = 0x20;
    lVar7 = 0;
    do {
      collectNamedStructureDefinitions
                (dst,(VarType *)((long)&(pSVar5->m_name)._M_dataplus._M_p + lVar4));
      lVar7 = lVar7 + 1;
      local_38 = (type->m_data).structPtr;
      pSVar5 = (local_38->m_members).
               super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0x38;
    } while (lVar7 < (int)((ulong)((long)(local_38->m_members).
                                         super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar5)
                          >> 3) * -0x49249249);
  }
  std::vector<glu::StructType_const*,std::allocator<glu::StructType_const*>>::
  emplace_back<glu::StructType_const*>
            ((vector<glu::StructType_const*,std::allocator<glu::StructType_const*>> *)dst,&local_38)
  ;
  return;
}

Assistant:

static void collectNamedStructureDefinitions (std::vector<const glu::StructType*>& dst, const glu::VarType& type)
{
	if (type.isBasicType())
		return;
	else if (type.isArrayType())
		return collectNamedStructureDefinitions(dst, type.getElementType());
	else if (type.isStructType())
	{
		if (type.getStructPtr()->hasTypeName())
		{
			// must be unique (may share the the same struct)
			std::vector<const glu::StructType*>::iterator where = std::find_if(dst.begin(), dst.end(), StructNameEqualPredicate(type.getStructPtr()->getTypeName()));
			if (where != dst.end())
			{
				DE_ASSERT(**where == *type.getStructPtr());

				// identical type has been added already, types of members must be added too
				return;
			}
		}

		// Add types of members first
		for (int ndx = 0; ndx < type.getStructPtr()->getNumMembers(); ++ndx)
			collectNamedStructureDefinitions(dst, type.getStructPtr()->getMember(ndx).getType());

		dst.push_back(type.getStructPtr());
	}
	else
		DE_ASSERT(false);
}